

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_13x13(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  JSAMPROW pJVar14;
  ulong uVar15;
  int iVar16;
  DCTELEM *pDVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  DCTELEM *local_148;
  DCTELEM local_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar15 = (ulong)start_col;
  lVar20 = 0;
  local_148 = data;
  do {
    pJVar14 = sample_data[lVar20];
    uVar30 = (uint)pJVar14[uVar15] + (uint)pJVar14[uVar15 + 0xc];
    uVar37 = (uint)pJVar14[uVar15 + 1] + (uint)pJVar14[uVar15 + 0xb];
    uVar21 = (uint)pJVar14[uVar15 + 2] + (uint)pJVar14[uVar15 + 10];
    uVar34 = (uint)pJVar14[uVar15 + 3] + (uint)pJVar14[uVar15 + 9];
    lVar28 = (ulong)pJVar14[uVar15] - (ulong)pJVar14[uVar15 + 0xc];
    uVar23 = (uint)pJVar14[uVar15 + 4] + (uint)pJVar14[uVar15 + 8];
    lVar32 = (ulong)pJVar14[uVar15 + 1] - (ulong)pJVar14[uVar15 + 0xb];
    lVar19 = (ulong)pJVar14[uVar15 + 2] - (ulong)pJVar14[uVar15 + 10];
    lVar18 = (ulong)pJVar14[uVar15 + 3] - (ulong)pJVar14[uVar15 + 9];
    uVar27 = (uint)pJVar14[uVar15 + 5] + (uint)pJVar14[uVar15 + 7];
    bVar1 = pJVar14[uVar15 + 6];
    lVar36 = (ulong)pJVar14[uVar15 + 4] - (ulong)pJVar14[uVar15 + 8];
    lVar33 = (ulong)pJVar14[uVar15 + 5] - (ulong)pJVar14[uVar15 + 7];
    *local_148 = uVar23 + bVar1 + uVar34 + uVar21 + uVar37 + uVar30 + uVar27 + -0x680;
    uVar25 = (ulong)((uint)bVar1 + (uint)bVar1);
    lVar31 = uVar30 - uVar25;
    lVar38 = uVar37 - uVar25;
    lVar22 = uVar21 - uVar25;
    lVar35 = uVar34 - uVar25;
    lVar24 = uVar23 - uVar25;
    lVar29 = uVar27 - uVar25;
    local_148[2] = (DCTELEM)((ulong)(lVar29 * 0x1fffffffd7ee + lVar24 * 0x1fffffffe64b + 0x1000 +
                                    lVar35 * 0x1ffffffffa8c + lVar22 * 0x100c +
                                    lVar38 * 0x21e0 + lVar31 * 0x2bf1) >> 0xd);
    lVar26 = (lVar38 - lVar29) * -0xa20 + (lVar35 - lVar24) * -0xdf2 + (lVar31 - lVar22) * 0x24f9;
    lVar22 = (lVar29 + lVar38) * 0xf95 + (lVar24 + lVar35) * -0x1dfe + (lVar22 + lVar31) * 0x319;
    local_148[4] = (DCTELEM)(lVar22 + lVar26 + 0x1000U >> 0xd);
    local_148[6] = (DCTELEM)((lVar26 - lVar22) + 0x1000U >> 0xd);
    lVar29 = (lVar32 + lVar28) * 0x2a50;
    lVar24 = (lVar19 + lVar28) * 0x253e;
    lVar22 = (lVar33 + lVar36) * 0xad5 + (lVar28 + lVar18) * 0x1e02;
    lVar26 = (lVar19 + lVar32) * -0xad5 + (lVar36 - lVar33) * 0x1e02;
    local_148[1] = (DCTELEM)((ulong)(lVar36 * 0xa33 + lVar24 +
                                     lVar29 + lVar28 * 0x1fffffffbf5b + 0x1000 + lVar22) >> 0xd);
    lVar28 = (lVar32 + lVar18) * -0x253e;
    local_148[3] = (DCTELEM)((ulong)(lVar36 * 0x1fffffffb511 + lVar28 +
                                     lVar32 * 0x1acb + lVar29 + 0x1000 + lVar26) >> 0xd);
    lVar29 = (lVar19 + lVar18) * -0x1508;
    local_148[5] = (DCTELEM)((ulong)(lVar26 + 0x1000 +
                                    lVar33 * 0x4853 + lVar29 + lVar19 * -0x324f + lVar24) >> 0xd);
    local_148[7] = (DCTELEM)((ulong)(lVar22 + 0x1000 +
                                    lVar33 * 0x1fffffffc83f + lVar28 + lVar18 * 0x4694 + lVar29) >>
                            0xd);
    pDVar17 = local_d8;
    if ((int)lVar20 != 7) {
      if ((int)lVar20 == 0xc) {
        lVar20 = 0;
        for (iVar16 = 7; -1 < iVar16; iVar16 = iVar16 + -1) {
          iVar2 = *(int *)((long)aiStack_58 + lVar20);
          iVar3 = *(int *)((long)data + lVar20);
          iVar4 = *(int *)((long)data + lVar20 + 0x20);
          lVar22 = (long)(iVar2 + iVar3);
          iVar5 = *(int *)((long)aiStack_78 + lVar20);
          lVar18 = (long)(iVar5 + iVar4);
          iVar6 = *(int *)((long)data + lVar20 + 0x40);
          iVar7 = *(int *)((long)aiStack_98 + lVar20);
          lVar24 = (long)(iVar7 + iVar6);
          iVar8 = *(int *)((long)data + lVar20 + 0x60);
          iVar9 = *(int *)((long)local_d8 + lVar20);
          iVar10 = *(int *)((long)aiStack_b8 + lVar20);
          lVar33 = (long)(iVar10 + iVar8);
          iVar11 = *(int *)((long)data + lVar20 + 0x80);
          lVar38 = (long)(iVar9 + iVar11);
          iVar12 = *(int *)((long)data + lVar20 + 0xa0);
          iVar13 = *(int *)((long)data + lVar20 + 0xe0);
          lVar19 = (long)(iVar13 + iVar12);
          lVar26 = (long)*(int *)((long)data + lVar20 + 0xc0);
          *(int *)((long)data + lVar20) =
               (int)((lVar38 + lVar19 + lVar26 + lVar24 + lVar33 + lVar18 + lVar22) * 0x183d +
                     0x2000U >> 0xe);
          lVar22 = lVar22 + lVar26 * -2;
          lVar18 = lVar18 + lVar26 * -2;
          lVar24 = lVar24 + lVar26 * -2;
          lVar33 = lVar33 + lVar26 * -2;
          lVar38 = lVar38 + lVar26 * -2;
          lVar19 = lVar19 + lVar26 * -2;
          *(int *)((long)data + lVar20 + 0x40) =
               (int)((ulong)(lVar19 * 0x3fffffffe1a6 + lVar38 * 0x3fffffffec87 + 0x2000 +
                            lVar33 * 0x3ffffffffbde + lVar24 * 0xc28 +
                            lVar18 * 0x19a8 + lVar22 * 0x2148) >> 0xe);
          lVar32 = (lVar18 - lVar19) * -0x7ab +
                   (lVar33 - lVar38) * -0xa90 + (lVar22 - lVar24) * 0x1c01;
          lVar35 = (long)(iVar3 - iVar2);
          lVar26 = (long)(iVar4 - iVar5);
          lVar28 = (long)(iVar6 - iVar7);
          lVar36 = (long)(iVar8 - iVar10);
          lVar31 = (long)(iVar11 - iVar9);
          lVar29 = (long)(iVar12 - iVar13);
          lVar22 = (lVar19 + lVar18) * 0xbcd +
                   (lVar38 + lVar33) * -0x16b8 + (lVar24 + lVar22) * 0x259;
          *(int *)((long)data + lVar20 + 0x80) = (int)(lVar22 + lVar32 + 0x2000U >> 0xe);
          *(int *)((long)data + lVar20 + 0xc0) = (int)((lVar32 - lVar22) + 0x2000U >> 0xe);
          lVar19 = (lVar26 + lVar35) * 0x200c;
          lVar24 = (lVar28 + lVar35) * 0x1c35;
          lVar18 = (lVar29 + lVar31) * 0x834 + (lVar36 + lVar35) * 0x16bb;
          lVar32 = (lVar28 + lVar26) * -0x834 + (lVar31 - lVar29) * 0x16bb;
          *(int *)((long)data + lVar20 + 0x20) =
               (int)((ulong)(lVar31 * 0x7ba + lVar24 + lVar19 + lVar35 * 0x3fffffffcf0a + 0x2000 +
                            lVar18) >> 0xe);
          lVar22 = (lVar36 + lVar26) * -0x1c35;
          *(int *)((long)data + lVar20 + 0x60) =
               (int)((ulong)(lVar31 * 0x3fffffffc73f + lVar22 + lVar19 + lVar26 * 0x144b + 0x2000 +
                            lVar32) >> 0xe);
          lVar19 = (lVar36 + lVar28) * -0xfee;
          *(int *)((long)data + lVar20 + 0xa0) =
               (int)((ulong)(lVar32 + 0x2000 + lVar29 * 0x36c7 + lVar19 + lVar28 * -0x261a + lVar24)
                    >> 0xe);
          *(int *)((long)data + lVar20 + 0xe0) =
               (int)((ulong)(lVar18 + 0x2000 +
                            lVar29 * 0x3fffffffd5c5 + lVar22 + lVar36 * 0x3575 + lVar19) >> 0xe);
          lVar20 = lVar20 + 4;
        }
        return;
      }
      pDVar17 = local_148 + 8;
    }
    lVar20 = lVar20 + 1;
    local_148 = pDVar17;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_13x13 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  INT32 z1, z2;
  DCTELEM workspace[8*5];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/26). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[12]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[11]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[10]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[9]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[8]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[7]);
    tmp6 = GETJSAMPLE(elemptr[6]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[12]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[11]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[10]);
    tmp13 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[9]);
    tmp14 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[8]);
    tmp15 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6 - 13 * CENTERJSAMPLE);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.373119086)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(1.058554052)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.501487041)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.170464608)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.803364869)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(1.252223920)),    /* c4 */
	      CONST_BITS);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(1.155388986)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.435816023)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.316450131));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.096834934)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.937303064)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.486914739));  /* (c8+c12)/2 */

    dataptr[4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.322312651));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(1.163874945));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.937797057)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.338443458));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(2.020082300)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.318774355));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.937797057)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.338443458));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(1.163874945)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.837223564)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(2.341699410));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.657217813)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.572116027)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(2.260109708));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(2.205608352)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.742345811));          /* c1+c11 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3, CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 13)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/13)**2 = 64/169, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/26) * 128/169.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*2];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*1];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*0];
    tmp5 = dataptr[DCTSIZE*5] + dataptr[DCTSIZE*7];
    tmp6 = dataptr[DCTSIZE*6];

    tmp10 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*4];
    tmp11 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*3];
    tmp12 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*2];
    tmp13 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*1];
    tmp14 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*0];
    tmp15 = dataptr[DCTSIZE*5] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1 + tmp2 + tmp3 + tmp4 + tmp5 + tmp6,
		       FIX(0.757396450)),          /* 128/169 */
	      CONST_BITS+1);
    tmp6 += tmp6;
    tmp0 -= tmp6;
    tmp1 -= tmp6;
    tmp2 -= tmp6;
    tmp3 -= tmp6;
    tmp4 -= tmp6;
    tmp5 -= tmp6;
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.039995521)) +   /* c2 */
	      MULTIPLY(tmp1, FIX(0.801745081)) +   /* c6 */
	      MULTIPLY(tmp2, FIX(0.379824504)) -   /* c10 */
	      MULTIPLY(tmp3, FIX(0.129109289)) -   /* c12 */
	      MULTIPLY(tmp4, FIX(0.608465700)) -   /* c8 */
	      MULTIPLY(tmp5, FIX(0.948429952)),    /* c4 */
	      CONST_BITS+1);
    z1 = MULTIPLY(tmp0 - tmp2, FIX(0.875087516)) - /* (c4+c6)/2 */
	 MULTIPLY(tmp3 - tmp4, FIX(0.330085509)) - /* (c2-c10)/2 */
	 MULTIPLY(tmp1 - tmp5, FIX(0.239678205));  /* (c8-c12)/2 */
    z2 = MULTIPLY(tmp0 + tmp2, FIX(0.073342435)) - /* (c4-c6)/2 */
	 MULTIPLY(tmp3 + tmp4, FIX(0.709910013)) + /* (c2+c10)/2 */
	 MULTIPLY(tmp1 + tmp5, FIX(0.368787494));  /* (c8+c12)/2 */

    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 - z2, CONST_BITS+1);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.001514908));   /* c3 */
    tmp2 = MULTIPLY(tmp10 + tmp12, FIX(0.881514751));   /* c5 */
    tmp3 = MULTIPLY(tmp10 + tmp13, FIX(0.710284161)) +  /* c7 */
	   MULTIPLY(tmp14 + tmp15, FIX(0.256335874));   /* c11 */
    tmp0 = tmp1 + tmp2 + tmp3 -
	   MULTIPLY(tmp10, FIX(1.530003162)) +          /* c3+c5+c7-c1 */
	   MULTIPLY(tmp14, FIX(0.241438564));           /* c9-c11 */
    tmp4 = MULTIPLY(tmp14 - tmp15, FIX(0.710284161)) -  /* c7 */
	   MULTIPLY(tmp11 + tmp12, FIX(0.256335874));   /* c11 */
    tmp5 = MULTIPLY(tmp11 + tmp13, - FIX(0.881514751)); /* -c5 */
    tmp1 += tmp4 + tmp5 +
	    MULTIPLY(tmp11, FIX(0.634110155)) -         /* c5+c9+c11-c3 */
	    MULTIPLY(tmp14, FIX(1.773594819));          /* c1+c7 */
    tmp6 = MULTIPLY(tmp12 + tmp13, - FIX(0.497774438)); /* -c9 */
    tmp2 += tmp4 + tmp6 -
	    MULTIPLY(tmp12, FIX(1.190715098)) +         /* c1+c5-c9-c11 */
	    MULTIPLY(tmp15, FIX(1.711799069));          /* c3+c7 */
    tmp3 += tmp5 + tmp6 +
	    MULTIPLY(tmp13, FIX(1.670519935)) -         /* c3+c5+c9-c7 */
	    MULTIPLY(tmp15, FIX(1.319646532));          /* c1+c11 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3, CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}